

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O3

int __thiscall jrtplib::RTPPacketBuilder::SetMaximumPacketSize(RTPPacketBuilder *this,size_t max)

{
  RTPMemoryManager *pRVar1;
  uint8_t *puVar2;
  
  if (max == 0) {
    return -0x13;
  }
  pRVar1 = (this->super_RTPMemoryObject).mgr;
  if (pRVar1 == (RTPMemoryManager *)0x0) {
    puVar2 = (uint8_t *)operator_new__(max);
  }
  else {
    puVar2 = (uint8_t *)(**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,max,9);
    if (puVar2 == (uint8_t *)0x0) {
      return -1;
    }
  }
  pRVar1 = (this->super_RTPMemoryObject).mgr;
  if (pRVar1 == (RTPMemoryManager *)0x0) {
    if (this->buffer != (uint8_t *)0x0) {
      operator_delete__(this->buffer);
    }
  }
  else {
    (**(code **)(*(long *)pRVar1 + 0x18))();
  }
  this->buffer = puVar2;
  this->maxpacksize = max;
  return 0;
}

Assistant:

int RTPPacketBuilder::SetMaximumPacketSize(size_t max)
{
	uint8_t *newbuf;

	if (max <= 0)
		return ERR_RTP_PACKBUILD_INVALIDMAXPACKETSIZE;
	newbuf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTPPACKETBUILDERBUFFER) uint8_t[max];
	if (newbuf == 0)
		return ERR_RTP_OUTOFMEM;
	
	RTPDeleteByteArray(buffer,GetMemoryManager());
	buffer = newbuf;
	maxpacksize = max;
	return 0;
}